

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

uint32_t __thiscall cppnet::BufferQueue::FindStr(BufferQueue *this,char *s,uint32_t s_len)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  element_type *peVar4;
  ListSlot<cppnet::BufferBlock> local_60;
  uint32_t can_read;
  uint32_t cur_len;
  shared_ptr<cppnet::BufferBlock> temp;
  uint32_t s_len_local;
  char *s_local;
  BufferQueue *this_local;
  
  temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       s_len;
  uVar2 = List<cppnet::BufferBlock>::Size(&this->_buffer_list);
  if (uVar2 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)&can_read);
    local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 0;
    local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = 0;
    while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&can_read), bVar1) {
      peVar4 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&can_read);
      local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_4_ = (*(peVar4->super_InnerBuffer).super_Buffer._vptr_Buffer[9])
                               (peVar4,s,(ulong)temp.
                                                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi._4_4_);
      if ((int)local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != 0) {
        local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ =
             (int)local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi +
             local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_;
        break;
      }
      bVar1 = std::operator==((shared_ptr<cppnet::BufferBlock> *)&can_read,&this->_buffer_write);
      if (bVar1) break;
      peVar4 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&can_read);
      iVar3 = (*(peVar4->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
      local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._4_4_ = local_60._next.
                     super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi._4_4_ + iVar3;
      std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&can_read);
      ListSlot<cppnet::BufferBlock>::GetNext(&local_60);
      std::shared_ptr<cppnet::BufferBlock>::operator=
                ((shared_ptr<cppnet::BufferBlock> *)&can_read,
                 (shared_ptr<cppnet::BufferBlock> *)&local_60);
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                ((shared_ptr<cppnet::BufferBlock> *)&local_60);
    }
    this_local._4_4_ =
         local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_;
    std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)&can_read);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferQueue::FindStr(const char* s, uint32_t s_len) {
    if (_buffer_list.Size() == 0) {
        return 0;
    }

    std::shared_ptr<BufferBlock> temp = _buffer_list.GetHead();
    uint32_t cur_len = 0;
    uint32_t can_read = 0;
    while (temp) {
        can_read = temp->FindStr(s, s_len);
        if (can_read > 0) {
            cur_len += can_read;
            break;
        }
        if (temp == _buffer_write) {
            break;
        }
        cur_len += temp->GetCanReadLength();
        temp = temp->GetNext();
    }
    return cur_len;
}